

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O1

void main_loop(void)

{
  string_view trigger;
  long *plVar1;
  size_t sVar2;
  char *pcVar3;
  char cVar4;
  int iVar5;
  ConsoleCommand *pCVar6;
  ostream *poVar7;
  int *piVar8;
  ulong uVar9;
  char *in_R9;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  input_split;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_50;
  
  plVar1 = Jupiter::plugins;
  do {
    if (plVar1[1] != *plVar1) {
      uVar9 = 0;
      do {
        cVar4 = Jupiter::Plugin::shouldRemove();
        if ((cVar4 == '\0') &&
           (iVar5 = (**(code **)**(undefined8 **)(*plVar1 + uVar9 * 8))(), iVar5 == 0)) {
          uVar9 = uVar9 + 1;
        }
        else {
          Jupiter::Plugin::free(uVar9);
        }
      } while (uVar9 < (ulong)(plVar1[1] - *plVar1 >> 3));
    }
    Jupiter::Timer::check();
    iVar5 = pthread_mutex_trylock((pthread_mutex_t *)&console_input.input_mutex);
    if (iVar5 == 0) {
      if (console_input.awaiting_processing == true) {
        console_input.awaiting_processing = false;
        jessilib::
        word_split_once<std::basic_string_view<char,std::char_traits<char>>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char_const*,char_const*>
                  (&local_50,(jessilib *)console_input.input._M_dataplus._M_p,
                   (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )(console_input.input._M_dataplus._M_p + console_input.input._M_string_length),
                   (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )0x110049,"",in_R9);
        pcVar3 = local_50.first._M_str;
        sVar2 = local_50.first._M_len;
        trigger._M_str = local_50.first._M_str;
        trigger._M_len = local_50.first._M_len;
        pCVar6 = getConsoleCommand(trigger);
        if (pCVar6 == (ConsoleCommand *)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Error: Command \"",0x10);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,pcVar3,sVar2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\" not found.",0xc);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
        }
        else {
          (*(pCVar6->super_Command)._vptr_Command[3])
                    (pCVar6,local_50.second._M_len,local_50.second._M_str);
        }
      }
      pthread_mutex_unlock((pthread_mutex_t *)&console_input.input_mutex);
    }
    local_50.first._M_len = 0;
    local_50.first._M_str = (char *)0xf4240;
    do {
      iVar5 = nanosleep((timespec *)&local_50,(timespec *)&local_50);
      if (iVar5 != -1) break;
      piVar8 = __errno_location();
    } while (*piVar8 == 4);
  } while( true );
}

Assistant:

[[noreturn]] void main_loop() {
	size_t index;
	while (1) {
		index = 0;
		while (index < Jupiter::plugins.size()) {
			if (Jupiter::plugins[index]->shouldRemove() || Jupiter::plugins[index]->think() != 0) {
				Jupiter::Plugin::free(index);
			}
			else {
				++index;
			}
		}
		Jupiter::Timer::check();

		if (console_input.input_mutex.try_lock()) {
			if (console_input.awaiting_processing) {
				console_input.awaiting_processing = false;
				auto input_split = jessilib::word_split_once_view(console_input.input, WHITESPACE_SV);
				std::string_view command_name = input_split.first;

				ConsoleCommand* command = getConsoleCommand(command_name);
				if (command != nullptr) {
					command->trigger(input_split.second);
				}
				else {
					std::cout << "Error: Command \"" << command_name << "\" not found." << std::endl;
				}
			}
			console_input.input_mutex.unlock();
		}
		std::this_thread::sleep_for((std::chrono::milliseconds(1)));
	}
}